

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void run_game_loop(void)

{
  cell_map local_38;
  
  while (((byte)stop_game_thread._M_base._M_i & 1) == 0) {
    next_generation(&local_38,&grid);
    cell_map::operator=(&grid,&local_38);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_38.cells.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    paint_grid();
    local_38._0_8_ = game_sleep_time._M_i;
    std::this_thread::sleep_for<double,std::ratio<1l,1000l>>
              ((duration<double,_std::ratio<1L,_1000L>_> *)&local_38);
  }
  return;
}

Assistant:

void run_game_loop()
  {
  while (!stop_game_thread)
    {
    grid = next_generation(grid);
    paint_grid();
    std::this_thread::sleep_for(std::chrono::duration<double, std::milli>(game_sleep_time));
    }
  }